

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void cdft(int n,int isgn,double *a,int *ip,double *w)

{
  if (-1 < isgn) {
    cftfsub(n,a,ip,*ip,w);
    return;
  }
  cftbsub(n,a,ip,*ip,w);
  return;
}

Assistant:

void cdft(int n, int isgn, double *a, int *ip, double *w) {
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
  int nw;

  nw = ip[0];
  if (isgn >= 0) {
    cftfsub(n, a, ip, nw, w);
  } else {
    cftbsub(n, a, ip, nw, w);
  }
}